

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

Node __thiscall xt::vector::pushTail(vector *this,Vector *v,uint level,Node *parent,Node *tailnode)

{
  element_type *peVar1;
  __shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Node *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  uint uVar3;
  Node NVar4;
  Node nodeToInsert;
  __shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2> local_d0;
  __shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2> local_c0;
  __shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2> local_b0;
  __shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2> local_90;
  __shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2> local_80;
  Node child;
  Object local_50;
  
  uVar3 = ((v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->cnt;
  this_00 = (_Node *)operator_new(0x10);
  _Node::_Node(this_00);
  std::__shared_ptr<xt::_Node,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<xt::_Node,void>
            ((__shared_ptr<xt::_Node,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  peVar1 = (((parent->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->array).
           super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::
  __copy_move_a<false,__gnu_cxx::__normal_iterator<xt::Object*,std::vector<xt::Object,std::allocator<xt::Object>>>,__gnu_cxx::__normal_iterator<xt::Object*,std::vector<xt::Object,std::allocator<xt::Object>>>>
            (*(Object **)
              &(peVar1->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)._M_impl,
             *(pointer *)
              ((long)&(peVar1->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)._M_impl
              + 8),*(Object **)**(undefined8 **)this);
  uVar3 = uVar3 - 1 >> ((byte)level & 0x1f) & 0x1f;
  nodeToInsert.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  nodeToInsert.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (level == 5) {
    std::__shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&nodeToInsert.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>,
               &tailnode->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>);
  }
  else {
    Object::Object(&local_50,
                   (Object *)
                   ((ulong)(uVar3 << 5) +
                   *(long *)&(((((parent->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr)->array).
                               super___shared_ptr<std::vector<xt::Object,_std::allocator<xt::Object>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->super__Vector_base<xt::Object,_std::allocator<xt::Object>_>)
                             ._M_impl));
    std::static_pointer_cast<xt::_Node,void>((shared_ptr<void> *)&child);
    if (child.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      std::__shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2> *)&local_a0,
                 &tailnode->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>);
      newPath((vector *)&local_c0,level - 5,(Node *)&local_a0);
    }
    else {
      std::__shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_d0,&v->super___shared_ptr<xt::_Vector,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_80,&child.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_90,&tailnode->super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>);
      pushTail((vector *)&local_c0,(Vector *)&local_d0,level - 5,(Node *)&local_80,(Node *)&local_90
              );
    }
    std::__shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&nodeToInsert.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>,&local_c0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_c0._M_refcount);
    p_Var2 = &local_a0;
    if (child.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
      p_Var2 = &local_d0;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&p_Var2->_M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&child.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b0,&nodeToInsert.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>);
  Object::Object<xt::_Node>((Object *)&child,(shared_ptr<xt::_Node> *)&local_b0);
  Object::operator=((Object *)((ulong)(uVar3 << 5) + *(long *)**(undefined8 **)this),
                    (Object *)&child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&nodeToInsert.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  NVar4.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  NVar4.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Node)NVar4.super___shared_ptr<xt::_Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Node pushTail(Vector v, unsigned int level, Node parent, Node tailnode) {
	unsigned int subidx = ((v->cnt -1) >> level) & 0x01f;
	Node ret = Node(new _Node);
	std::copy(parent->array->begin(), parent->array->end(), ret->array->begin());
	Node nodeToInsert;
	if (level == 5)
		nodeToInsert = tailnode;
	else {
		Node child = to_node((*parent->array)[subidx]);
		nodeToInsert = (child != nullptr) ? pushTail(v, level - 5, child, tailnode) : newPath(level - 5, tailnode);
	}
	(*ret->array)[subidx] = nodeToInsert;
	return ret;
}